

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts round_canonical(FloatParts p,float_status *s,FloatFmt *parm)

{
  char cVar1;
  FloatParts FVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint64_t uVar6;
  bool bVar7;
  ulong local_c8;
  ulong local_c0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  byte local_79;
  byte local_78;
  _Bool is_tiny;
  uint uStack_74;
  _Bool overflow_norm;
  int flags;
  int exp;
  uint64_t inc;
  uint64_t frac;
  int frac_shift;
  int exp_max;
  uint64_t roundeven_mask;
  uint64_t round_mask;
  uint64_t frac_lsbm1;
  uint64_t frac_lsb;
  FloatFmt *parm_local;
  float_status *s_local;
  FloatParts p_local;
  
  uVar6 = p._8_8_;
  s_local = (float_status *)p.frac;
  frac_lsbm1 = parm->frac_lsb;
  round_mask = parm->frac_lsbm1;
  roundeven_mask = parm->round_mask;
  _frac_shift = parm->roundeven_mask;
  frac._4_4_ = parm->exp_max;
  frac._0_4_ = parm->frac_shift;
  bVar4 = 0;
  local_78 = 0;
  bVar3 = local_78;
  local_78 = 0;
  p_local.frac._0_4_ = p.exp;
  p_local.frac._4_1_ = p.cls;
  uVar5 = p_local.frac._4_1_ - 1;
  inc = (uint64_t)s_local;
  frac_lsb = (uint64_t)parm;
  parm_local = (FloatFmt *)s;
  p_local.frac = uVar6;
  if (3 < uVar5 && p_local.frac._4_1_ != 5) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,0x34b,(char *)0x0);
  }
  switch((long)&switchD_012cf617::switchdataD_013d0470 +
         (long)(int)(&switchD_012cf617::switchdataD_013d0470)[uVar5]) {
  case 0x12cf619:
    p_local.frac._5_1_ = p.sign;
    switch(s->float_rounding_mode) {
    case '\0':
      local_79 = 0;
      local_98 = round_mask;
      if (((ulong)s_local & _frac_shift) == round_mask) {
        local_98 = 0;
      }
      _flags = local_98;
      break;
    case '\x01':
      local_a8 = roundeven_mask;
      if (((undefined1  [16])p & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
        local_a8 = 0;
      }
      _flags = local_a8;
      local_79 = (p_local.frac._5_1_ ^ 0xff) & 1;
      break;
    case '\x02':
      local_a0 = roundeven_mask;
      if (((undefined1  [16])p & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        local_a0 = 0;
      }
      _flags = local_a0;
      local_79 = p_local.frac._5_1_ & 1;
      break;
    case '\x03':
      local_79 = 1;
      _flags = 0;
      break;
    case '\x04':
      local_79 = 0;
      _flags = round_mask;
      break;
    case '\x05':
      local_79 = 1;
      local_b0 = roundeven_mask;
      if (((ulong)s_local & frac_lsbm1) != 0) {
        local_b0 = 0;
      }
      _flags = local_b0;
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x2ee,(char *)0x0);
    }
    uStack_74 = parm->exp_bias + (int)p_local.frac;
    p_local.frac._5_3_ = p._13_3_;
    if (0 < (int)uStack_74) {
      local_78 = bVar4;
      if (((ulong)s_local & roundeven_mask) != 0) {
        local_78 = 0x20;
        inc = (uint64_t)(&s_local->float_detect_tininess + _flags);
        if ((inc & 0x8000000000000000) != 0) {
          inc = inc >> 1;
          uStack_74 = uStack_74 + 1;
        }
      }
      inc = inc >> ((byte)(int)frac & 0x3f);
      if ((parm->arm_althp & 1U) != 0) {
        if ((int)frac._4_4_ < (int)uStack_74) {
          local_78 = 1;
          inc = 0xffffffffffffffff;
          uStack_74 = frac._4_4_;
        }
        goto LAB_012cfaac;
      }
      if ((int)uStack_74 < (int)frac._4_4_) goto LAB_012cfaac;
      local_78 = 0x28;
      if (local_79 != 0) {
        inc = 0xffffffffffffffff;
        uStack_74 = frac._4_4_ - 1;
        local_78 = 0x28;
        goto LAB_012cfaac;
      }
      p_local.frac._0_5_ = CONCAT14(3,(int)p_local.frac);
      goto LAB_012cfa13;
    }
    if (s->flush_to_zero == '\0') {
      bVar7 = true;
      if ((s->float_detect_tininess != '\x01') && (bVar7 = true, -1 < (int)uStack_74)) {
        bVar7 = ((ulong)(&s_local->float_detect_tininess + _flags) & 0x8000000000000000) == 0;
      }
      shift64RightJamming((uint64_t)s_local,1 - uStack_74,&inc);
      if ((inc & roundeven_mask) != 0) {
        cVar1 = *(char *)((long)&parm_local->exp_size + 1);
        if (cVar1 == '\0') {
          if ((inc & _frac_shift) == round_mask) {
            local_c0 = 0;
          }
          else {
            local_c0 = round_mask;
          }
          _flags = local_c0;
        }
        else if (cVar1 == '\x05') {
          if ((inc & frac_lsbm1) == 0) {
            local_c8 = roundeven_mask;
          }
          else {
            local_c8 = 0;
          }
          _flags = local_c8;
        }
        bVar4 = 0x20;
        inc = _flags + inc;
      }
      uStack_74 = (uint)((inc & 0x4000000000000000) != 0);
      inc = inc >> ((byte)(int)frac & 0x3f);
      if ((bVar7) && (bVar4 != 0)) {
        bVar4 = bVar4 | 0x10;
      }
      uVar6 = p_local.frac;
      local_78 = bVar4;
      if ((uStack_74 == 0) && (inc == 0)) {
        p_local.frac._0_5_ = CONCAT14(1,(int)p_local.frac);
        uVar6 = p_local.frac;
      }
      goto LAB_012cfaac;
    }
    local_78 = 0x80;
    p_local.frac._0_5_ = CONCAT14(1,(int)p_local.frac);
    break;
  case 0x12cf9fb:
    local_78 = bVar3;
    break;
  case 0x12cfa11:
    local_78 = bVar3;
LAB_012cfa13:
    if ((parm->arm_althp & 1U) != 0) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x33e,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    inc = 0;
    uStack_74 = frac._4_4_;
    uVar6 = p_local.frac;
    goto LAB_012cfaac;
  case 0x12cfa4e:
    if ((parm->arm_althp & 1U) != 0) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x345,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    inc = (ulong)s_local >> ((byte)parm->frac_shift & 0x3f);
    uStack_74 = frac._4_4_;
    goto LAB_012cfaac;
  }
  uStack_74 = 0;
  inc = 0;
  uVar6 = p_local.frac;
LAB_012cfaac:
  p_local.frac = uVar6;
  float_raise_tricore(local_78,(float_status *)parm_local);
  FVar2.exp = uStack_74;
  FVar2.cls = p_local.frac._4_1_;
  FVar2.sign = (_Bool)p_local.frac._5_1_;
  FVar2._14_2_ = p_local.frac._6_2_;
  FVar2.frac = inc;
  return FVar2;
}

Assistant:

static FloatParts round_canonical(FloatParts p, float_status *s,
                                  const FloatFmt *parm)
{
    const uint64_t frac_lsb = parm->frac_lsb;
    const uint64_t frac_lsbm1 = parm->frac_lsbm1;
    const uint64_t round_mask = parm->round_mask;
    const uint64_t roundeven_mask = parm->roundeven_mask;
    const int exp_max = parm->exp_max;
    const int frac_shift = parm->frac_shift;
    uint64_t frac, inc = 0;
    int exp, flags = 0;
    bool overflow_norm = false;

    frac = p.frac;
    exp = p.exp;

    switch (p.cls) {
    case float_class_normal:
        switch (s->float_rounding_mode) {
        case float_round_nearest_even:
            overflow_norm = false;
            inc = ((frac & roundeven_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
            break;
        case float_round_ties_away:
            overflow_norm = false;
            inc = frac_lsbm1;
            break;
        case float_round_to_zero:
            overflow_norm = true;
            inc = 0;
            break;
        case float_round_up:
            inc = p.sign ? 0 : round_mask;
            overflow_norm = p.sign;
            break;
        case float_round_down:
            inc = p.sign ? round_mask : 0;
            overflow_norm = !p.sign;
            break;
        case float_round_to_odd:
            overflow_norm = true;
            inc = frac & frac_lsb ? 0 : round_mask;
            break;
        default:
            g_assert_not_reached();
            break;
        }

        exp += parm->exp_bias;
        if (likely(exp > 0)) {
            if (frac & round_mask) {
                flags |= float_flag_inexact;
                frac += inc;
                if (frac & DECOMPOSED_OVERFLOW_BIT) {
                    frac >>= 1;
                    exp++;
                }
            }
            frac >>= frac_shift;

            if (parm->arm_althp) {
                /* ARM Alt HP eschews Inf and NaN for a wider exponent.  */
                if (unlikely(exp > exp_max)) {
                    /* Overflow.  Return the maximum normal.  */
                    flags = float_flag_invalid;
                    exp = exp_max;
                    frac = -1;
                }
            } else if (unlikely(exp >= exp_max)) {
                flags |= float_flag_overflow | float_flag_inexact;
                if (overflow_norm) {
                    exp = exp_max - 1;
                    frac = -1;
                } else {
                    p.cls = float_class_inf;
                    goto do_inf;
                }
            }
        } else if (s->flush_to_zero) {
            flags |= float_flag_output_denormal;
            p.cls = float_class_zero;
            goto do_zero;
        } else {
            bool is_tiny = (s->float_detect_tininess
                            == float_tininess_before_rounding)
                        || (exp < 0)
                        || !((frac + inc) & DECOMPOSED_OVERFLOW_BIT);

            shift64RightJamming(frac, 1 - exp, &frac);
            if (frac & round_mask) {
                /* Need to recompute round-to-even.  */
                switch (s->float_rounding_mode) {
                case float_round_nearest_even:
                    inc = ((frac & roundeven_mask) != frac_lsbm1
                           ? frac_lsbm1 : 0);
                    break;
                case float_round_to_odd:
                    inc = frac & frac_lsb ? 0 : round_mask;
                    break;
                }
                flags |= float_flag_inexact;
                frac += inc;
            }

            exp = (frac & DECOMPOSED_IMPLICIT_BIT ? 1 : 0);
            frac >>= frac_shift;

            if (is_tiny && (flags & float_flag_inexact)) {
                flags |= float_flag_underflow;
            }
            if (exp == 0 && frac == 0) {
                p.cls = float_class_zero;
            }
        }
        break;

    case float_class_zero:
    do_zero:
        exp = 0;
        frac = 0;
        break;

    case float_class_inf:
    do_inf:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac = 0;
        break;

    case float_class_qnan:
    case float_class_snan:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac >>= parm->frac_shift;
        break;

    default:
        g_assert_not_reached();
        break;
    }

    float_raise(flags, s);
    p.exp = exp;
    p.frac = frac;
    return p;
}